

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_set1_tls_channel_id(SSL *ssl,EVP_PKEY *private_key)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  EVP_PKEY *local_20;
  EVP_PKEY *private_key_local;
  SSL *ssl_local;
  
  local_20 = private_key;
  private_key_local = (EVP_PKEY *)ssl;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    iVar2 = is_p256_key(local_20);
    if (iVar2 == 0) {
      ERR_put_error(0x10,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x934);
      ssl_local._4_4_ = 0;
    }
    else {
      bssl::UpRef((bssl *)&local_28,local_20);
      pSVar3 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)
                          &private_key_local->pkey);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=
                (&pSVar3->channel_id_private,&local_28);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
      ssl_local._4_4_ = 1;
    }
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set1_tls_channel_id(SSL *ssl, EVP_PKEY *private_key) {
  if (!ssl->config) {
    return 0;
  }
  if (!is_p256_key(private_key)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CHANNEL_ID_NOT_P256);
    return 0;
  }

  ssl->config->channel_id_private = UpRef(private_key);
  return 1;
}